

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderStructTests.cpp
# Opt level: O3

int __thiscall deqp::ShaderStructCase::init(ShaderStructCase *this,EVP_PKEY_CTX *ctx)

{
  pointer *ppTVar1;
  WrapMode WVar2;
  int iVar3;
  Texture2D *this_00;
  long lVar4;
  TextureBinding *pTVar5;
  byte bVar6;
  TextureBinding local_a8;
  Sampler local_58;
  
  bVar6 = 0;
  if (this->m_usesTexture == true) {
    this_00 = (Texture2D *)operator_new(0x70);
    glu::Texture2D::Texture2D(this_00,(this->super_ShaderRenderCase).m_renderCtx,0x8058,0x80,0x80);
    this->m_gradientTexture = this_00;
    tcu::Texture2D::allocLevel(&this_00->m_refTexture,0);
    local_a8.m_type = TYPE_NONE;
    local_a8.m_sampler.wrapS = CLAMP_TO_EDGE;
    local_a8.m_sampler.wrapT = CLAMP_TO_EDGE;
    local_a8.m_sampler.wrapR = CLAMP_TO_EDGE;
    local_58.wrapS = 0x3f800000;
    local_58.wrapT = 0x3f800000;
    local_58.wrapR = 0x3f800000;
    local_58.minFilter = 0x3f800000;
    tcu::fillWithComponentGradients
              ((this->m_gradientTexture->m_refTexture).super_TextureLevelPyramid.m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start,(Vec4 *)&local_a8,(Vec4 *)&local_58);
    (*this->m_gradientTexture->_vptr_Texture2D[2])();
    local_58.wrapS = CLAMP_TO_EDGE;
    local_58.wrapT = CLAMP_TO_EDGE;
    local_58.wrapR = CLAMP_TO_EDGE;
    local_58.minFilter = LINEAR;
    local_58.magFilter = LINEAR;
    local_58.lodThreshold = 0.0;
    local_58.normalizedCoords = true;
    local_58.depthStencilMode = MODE_DEPTH;
    local_58.compare = COMPAREMODE_NONE;
    local_58.compareChannel = 0;
    local_58.borderColor.v.uData[0]._0_1_ = 0;
    local_58.borderColor.v._1_7_ = 0;
    local_58.borderColor.v.uData[2]._0_1_ = 0;
    local_58._45_8_ = 0;
    TextureBinding::TextureBinding(&local_a8,this->m_gradientTexture,&local_58);
    ctx = (EVP_PKEY_CTX *)
          (this->super_ShaderRenderCase).m_textures.
          super__Vector_base<deqp::TextureBinding,_std::allocator<deqp::TextureBinding>_>._M_impl.
          super__Vector_impl_data._M_finish;
    if ((TextureBinding *)ctx ==
        (this->super_ShaderRenderCase).m_textures.
        super__Vector_base<deqp::TextureBinding,_std::allocator<deqp::TextureBinding>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<deqp::TextureBinding,_std::allocator<deqp::TextureBinding>_>::
      _M_realloc_insert<deqp::TextureBinding>
                (&(this->super_ShaderRenderCase).m_textures,(iterator)ctx,&local_a8);
    }
    else {
      pTVar5 = &local_a8;
      for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
        WVar2 = (pTVar5->m_sampler).wrapS;
        ((TextureBinding *)ctx)->m_type = pTVar5->m_type;
        (((TextureBinding *)ctx)->m_sampler).wrapS = WVar2;
        pTVar5 = (TextureBinding *)((long)pTVar5 + (ulong)bVar6 * -0x10 + 8);
        ctx = (EVP_PKEY_CTX *)((long)ctx + (ulong)bVar6 * -0x10 + 8);
      }
      ppTVar1 = &(this->super_ShaderRenderCase).m_textures.
                 super__Vector_base<deqp::TextureBinding,_std::allocator<deqp::TextureBinding>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppTVar1 = *ppTVar1 + 1;
      ctx = (EVP_PKEY_CTX *)pTVar5;
    }
  }
  iVar3 = ShaderRenderCase::init(&this->super_ShaderRenderCase,ctx);
  return iVar3;
}

Assistant:

void ShaderStructCase::init(void)
{
	if (m_usesTexture)
	{
		m_gradientTexture = new glu::Texture2D(m_renderCtx, GL_RGBA8, 128, 128);

		m_gradientTexture->getRefTexture().allocLevel(0);
		tcu::fillWithComponentGradients(m_gradientTexture->getRefTexture().getLevel(0), tcu::Vec4(0.0f),
										tcu::Vec4(1.0f));
		m_gradientTexture->upload();

		m_textures.push_back(TextureBinding(
			m_gradientTexture, tcu::Sampler(tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::CLAMP_TO_EDGE,
											tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::LINEAR, tcu::Sampler::LINEAR)));
		DE_ASSERT(m_textures.size() == 1);
	}
	ShaderRenderCase::init();
}